

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

void __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::
step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)9>_>
          (byte param_1,xpath_node_set_raw *ns,xml_node_struct *xn,long *alloc)

{
  xpath_memory_block *alloc_00;
  
  alloc_00 = (xpath_memory_block *)*alloc;
  if (alloc_00 == (xpath_memory_block *)0x0 || alloc[1] != 0) {
    if (alloc_00 != (xpath_memory_block *)0x0 && alloc[1] != 0) {
LAB_001178a1:
      step_push((xpath_ast_node *)(ulong)param_1,ns,xn,(xpath_allocator *)alloc_00);
      return;
    }
  }
  else {
    alloc_00 = ((xpath_allocator *)((long)alloc_00 + 0x18))->_root;
    if (alloc_00 != (xpath_memory_block *)0x0) goto LAB_001178a1;
  }
  return;
}

Assistant:

void step_fill(xpath_node_set_raw& ns, const xpath_node& xn, xpath_allocator* alloc, bool once, T v)
		{
			const axis_t axis = T::axis;
			const bool axis_has_attributes = (axis == axis_ancestor || axis == axis_ancestor_or_self || axis == axis_descendant_or_self || axis == axis_following || axis == axis_parent || axis == axis_preceding || axis == axis_self);

			if (xn.node())
				step_fill(ns, xn.node().internal_object(), alloc, once, v);
			else if (axis_has_attributes && xn.attribute() && xn.parent())
				step_fill(ns, xn.attribute().internal_object(), xn.parent().internal_object(), alloc, once, v);
		}